

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O0

shared_ptr<const_mathiu::impl::Expr> __thiscall
mathiu::impl::insertSum<mathiu::impl::Sum,std::shared_ptr<mathiu::impl::Expr_const>>
          (impl *this,Sum *c,shared_ptr<const_mathiu::impl::Expr> *t)

{
  initializer_list<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  __l;
  element_type *e;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_mathiu::impl::Expr> sVar1;
  pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
  *local_e0;
  allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  local_b7;
  ExprPtrLess local_b6;
  undefined1 local_b5;
  pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
  local_a8;
  pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
  *local_88;
  pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
  local_80;
  undefined1 local_60 [64];
  shared_ptr<const_mathiu::impl::Expr> *local_20;
  shared_ptr<const_mathiu::impl::Expr> *t_local;
  Sum *c_local;
  
  local_b5 = 1;
  local_88 = &local_80;
  local_20 = t;
  t_local = (shared_ptr<const_mathiu::impl::Expr> *)c;
  c_local = (Sum *)this;
  e = std::__shared_ptr_access<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator*((__shared_ptr_access<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)t);
  coeffAndTerm(&local_a8,e);
  std::
  pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
  ::pair<std::shared_ptr<const_mathiu::impl::Expr>,_true>(&local_80,&local_a8.second,local_20);
  local_b5 = 0;
  local_60._0_8_ = &local_80;
  local_60._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  std::
  allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::allocator(&local_b7);
  __l._M_len = local_60._8_8_;
  __l._M_array = (iterator)local_60._0_8_;
  std::
  map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  ::map((map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
         *)(local_60 + 0x10),__l,&local_b6,&local_b7);
  mergeSum<mathiu::impl::Sum>(this,c,(Sum *)(local_60 + 0x10));
  Sum::~Sum((Sum *)(local_60 + 0x10));
  std::
  allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::~allocator(&local_b7);
  local_e0 = (pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
              *)local_60;
  do {
    local_e0 = local_e0 + -1;
    std::
    pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
    ::~pair(local_e0);
  } while (local_e0 != &local_80);
  std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>::
  ~pair(&local_a8);
  sVar1.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_mathiu::impl::Expr>)
         sVar1.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

auto insertSum(C const &c, T const &t)
    {
        return mergeSum(c, C{{{coeffAndTerm(*t).second, t}}});
    }